

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O3

void handleSelectionRequest(XEvent *event)

{
  Atom AVar1;
  char *pcVar2;
  Display *pDVar3;
  size_t sVar4;
  Atom AVar5;
  Window WVar6;
  Atom AVar7;
  ulong uVar8;
  Atom *pAVar9;
  undefined8 uVar10;
  long local_158;
  char *local_150;
  ulong local_148;
  Atom local_140;
  XEvent *local_138;
  int actualFormat;
  undefined1 local_128 [8];
  unsigned_long itemCount;
  Atom targets [4];
  undefined4 local_f0 [6];
  Display *local_d8;
  int local_d0;
  int iStack_cc;
  int iStack_c8;
  int iStack_c4;
  Time local_c0;
  Atom local_b8;
  Window local_b0;
  
  AVar7 = 0;
  memset(local_f0,0,0xc0);
  AVar5 = _glfw.x11.UTF8_STRING;
  pDVar3 = _glfw.x11.display;
  AVar1 = (event->xselectionrequest).property;
  if (AVar1 == 0) goto LAB_00114370;
  AVar7 = (event->xselectionrequest).target;
  if (AVar7 == _glfw.x11.TARGETS) {
    pAVar9 = targets;
    targets[1] = _glfw.x11.MULTIPLE;
    targets[2] = _glfw.x11.UTF8_STRING;
    targets[3] = 0x1f;
    WVar6 = (event->xkey).root;
    uVar10 = 4;
    AVar5 = 4;
    targets[0] = AVar7;
LAB_00114220:
    XChangeProperty(_glfw.x11.display,WVar6,AVar1,AVar5,0x20,0,pAVar9,uVar10);
  }
  else {
    pcVar2 = *(char **)(_glfw.x11.keyName +
                       (ulong)((event->xkey).subwindow != _glfw.x11.PRIMARY) * 8 + -0x10);
    local_150 = pcVar2;
    if (AVar7 != _glfw.x11.MULTIPLE) {
      if (AVar7 != _glfw.x11.SAVE_TARGETS) {
        if (AVar7 == 0x1f || AVar7 == _glfw.x11.UTF8_STRING) {
          WVar6 = (event->xkey).root;
          sVar4 = strlen(pcVar2);
          XChangeProperty(pDVar3,WVar6,AVar1,AVar7,8,0,pcVar2,sVar4);
          AVar7 = (event->xselectionrequest).property;
        }
        else {
          AVar7 = 0;
        }
        goto LAB_00114370;
      }
      WVar6 = (event->xkey).root;
      uVar10 = 0;
      pAVar9 = (Atom *)0x0;
      AVar5 = _glfw.x11.NULL_;
      goto LAB_00114220;
    }
    XGetWindowProperty(_glfw.x11.display,(event->xkey).root,AVar1,0,0x7fffffffffffffff,0,
                       _glfw.x11.ATOM_PAIR,targets,&actualFormat,&itemCount,local_128,&local_158);
    if (itemCount != 0) {
      uVar8 = 0;
      local_140 = AVar5;
      local_148 = itemCount;
      local_138 = event;
      do {
        pcVar2 = local_150;
        pDVar3 = _glfw.x11.display;
        AVar1 = *(Atom *)(local_158 + uVar8 * 8);
        if (AVar1 == 0x1f || AVar1 == AVar5) {
          WVar6 = (event->xkey).root;
          uVar10 = *(undefined8 *)(local_158 + 8 + uVar8 * 8);
          sVar4 = strlen(local_150);
          event = local_138;
          AVar5 = local_140;
          XChangeProperty(pDVar3,WVar6,uVar10,AVar1,8,0,pcVar2,sVar4);
          itemCount = local_148;
        }
        else {
          *(undefined8 *)(local_158 + 8 + uVar8 * 8) = 0;
        }
        uVar8 = uVar8 + 2;
      } while (uVar8 < itemCount);
    }
    XChangeProperty(_glfw.x11.display,(event->xkey).root,(event->xselectionrequest).property,
                    _glfw.x11.ATOM_PAIR,0x20,0,local_158,itemCount);
    XFree(local_158);
  }
  AVar7 = (event->xselectionrequest).property;
LAB_00114370:
  local_f0[0] = 0x1f;
  local_d8 = (event->xany).display;
  local_d0 = (event->xfocus).mode;
  iStack_cc = (event->xfocus).detail;
  iStack_c8 = (event->xexpose).width;
  iStack_c4 = (event->xexpose).height;
  local_c0 = (event->xkey).time;
  local_b0 = (event->xconfigure).above;
  local_b8 = AVar7;
  XSendEvent(_glfw.x11.display,(event->xkey).root,0,0);
  return;
}

Assistant:

static void handleSelectionRequest(XEvent* event)
{
    const XSelectionRequestEvent* request = &event->xselectionrequest;

    XEvent reply;
    memset(&reply, 0, sizeof(reply));

    reply.xselection.property = writeTargetToProperty(request);
    reply.xselection.type = SelectionNotify;
    reply.xselection.display = request->display;
    reply.xselection.requestor = request->requestor;
    reply.xselection.selection = request->selection;
    reply.xselection.target = request->target;
    reply.xselection.time = request->time;

    XSendEvent(_glfw.x11.display, request->requestor, False, 0, &reply);
}